

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O3

int pkcs8_pbe_decrypt(uint8_t **out,size_t *out_len,CBS *algorithm,char *pass,size_t pass_len,
                     uint8_t *in,size_t in_len)

{
  int iVar1;
  uchar *out_00;
  pbe_suite *ppVar2;
  int iVar3;
  long lVar4;
  int n1;
  int n2;
  CBS obj;
  ScopedEVP_CIPHER_CTX ctx;
  int local_f8;
  int local_f4;
  uint8_t **local_f0;
  size_t *local_e8;
  uint8_t *local_e0;
  CBS local_d8;
  EVP_CIPHER_CTX local_c8;
  
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_c8);
  iVar1 = CBS_get_asn1(algorithm,&local_d8,6);
  if (iVar1 == 0) {
    iVar1 = 0x68;
    iVar3 = 0x149;
  }
  else {
    ppVar2 = kBuiltinPBE;
    lVar4 = 4;
    local_f0 = out;
    local_e8 = out_len;
    local_e0 = in;
    do {
      iVar1 = CBS_mem_equal(&local_d8,ppVar2->oid,(ulong)ppVar2->oid_len);
      if (iVar1 != 0) {
        iVar1 = (*ppVar2->decrypt_init)(ppVar2,&local_c8,pass,pass_len,algorithm);
        if (iVar1 == 0) {
          iVar1 = 0x6d;
          iVar3 = 0x159;
          goto LAB_0050c88a;
        }
        out_00 = (uchar *)OPENSSL_malloc(in_len);
        iVar3 = 0;
        iVar1 = 0;
        if (out_00 == (uchar *)0x0) goto LAB_0050c88f;
        if (in_len >> 0x1f != 0) {
          iVar3 = 0;
          ERR_put_error(0x13,0,0x45,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                        ,0x163);
          goto LAB_0050c892;
        }
        iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)&local_c8,out_00,&local_f8,local_e0,(int)in_len)
        ;
        if (iVar1 == 0) goto LAB_0050c892;
        iVar1 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)&local_c8,out_00 + local_f8,&local_f4);
        if (iVar1 == 0) goto LAB_0050c892;
        *local_f0 = out_00;
        *local_e8 = (long)local_f4 + (long)local_f8;
        iVar1 = 1;
        goto LAB_0050c88f;
      }
      ppVar2 = ppVar2 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    iVar1 = 0x77;
    iVar3 = 0x154;
  }
LAB_0050c88a:
  ERR_put_error(0x13,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                ,iVar3);
  iVar1 = 0;
LAB_0050c88f:
  iVar3 = iVar1;
  out_00 = (uchar *)0x0;
LAB_0050c892:
  OPENSSL_free(out_00);
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_c8);
  return iVar3;
}

Assistant:

int pkcs8_pbe_decrypt(uint8_t **out, size_t *out_len, CBS *algorithm,
                      const char *pass, size_t pass_len, const uint8_t *in,
                      size_t in_len) {
  int ret = 0;
  uint8_t *buf = NULL;
  bssl::ScopedEVP_CIPHER_CTX ctx;

  CBS obj;
  const struct pbe_suite *suite = NULL;
  if (!CBS_get_asn1(algorithm, &obj, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    goto err;
  }

  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(kBuiltinPBE); i++) {
    if (CBS_mem_equal(&obj, kBuiltinPBE[i].oid, kBuiltinPBE[i].oid_len)) {
      suite = &kBuiltinPBE[i];
      break;
    }
  }
  if (suite == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNKNOWN_ALGORITHM);
    goto err;
  }

  if (!suite->decrypt_init(suite, ctx.get(), pass, pass_len, algorithm)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_KEYGEN_FAILURE);
    goto err;
  }

  buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(in_len));
  if (buf == NULL) {
    goto err;
  }

  if (in_len > INT_MAX) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
    goto err;
  }

  int n1, n2;
  if (!EVP_DecryptUpdate(ctx.get(), buf, &n1, in, (int)in_len) ||
      !EVP_DecryptFinal_ex(ctx.get(), buf + n1, &n2)) {
    goto err;
  }

  *out = buf;
  *out_len = n1 + n2;
  ret = 1;
  buf = NULL;

err:
  OPENSSL_free(buf);
  return ret;
}